

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_26(QPDF *pdf,char *arg2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar1;
  QPDFObjectHandle QVar2;
  allocator<char> local_d9;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0 [3];
  QPDFObjectHandle O3;
  QPDF oldpdf;
  allocator<char> local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  QPDFObjectHandle qtest;
  element_type local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  QPDFPageObjectHelper local_50;
  
  if (arg2 != (char *)0x0) {
    QPDF::QPDF(&oldpdf);
    QPDF::processFile((char *)&oldpdf,arg2);
    QPDF::getTrailer();
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/QTest",local_a0);
    QPDFObjectHandle::getKey((string *)&qtest);
    std::__cxx11::string::~string((string *)&w);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&O3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/O3",local_a0);
    QPDFObjectHandle::getKey((string *)&O3);
    std::__cxx11::string::~string((string *)&w);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w,pdf);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&O3);
    QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_60;
    QPDFPageObjectHelper::QPDFPageObjectHelper(&local_50,QVar2);
    QPDFPageDocumentHelper::addPage((QPDFPageObjectHelper *)&w,SUB81(&local_50,0));
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w);
    QPDF::getTrailer();
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/QTest",&local_d9);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&qtest);
    QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_80;
    QPDF::copyForeignObject(QVar1);
    QPDFObjectHandle::replaceKey((string *)local_a0,(QPDFObjectHandle *)&w);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::__cxx11::string::~string((string *)&w);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&O3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&qtest.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDF::~QPDF(&oldpdf);
    QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
    QPDFWriter::setStaticID(SUB81(&w,0));
    QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&w);
    QPDFWriter::write();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_d0);
    return;
  }
  __assert_fail("arg2 != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x3d8,"void test_26(QPDF &, const char *)");
}

Assistant:

static void
test_26(QPDF& pdf, char const* arg2)
{
    // Copy the O3 page using addPage.  Copy qtest without
    // crossing page boundaries.  In addition to previous results,
    // should get page O3 but no other pages including the page
    // that O3 points to.  Also, inherited object will have been
    // pushed down and will be preserved.

    {
        // Make sure original PDF is out of scope when we write.
        assert(arg2 != nullptr);
        QPDF oldpdf;
        oldpdf.processFile(arg2);
        QPDFObjectHandle qtest = oldpdf.getTrailer().getKey("/QTest");
        QPDFObjectHandle O3 = qtest.getKey("/O3");
        QPDFPageDocumentHelper(pdf).addPage(O3, false);
        pdf.getTrailer().replaceKey("/QTest", pdf.copyForeignObject(qtest));
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}